

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predictor_enc.c
# Opt level: O0

void CopyImageWithPrediction
               (int width,int height,int bits,uint32_t *modes,uint32_t *argb_scratch,uint32_t *argb,
               int low_effort,int max_quantization,int exact,int used_subtract_green)

{
  uint32_t *puVar1;
  uint32_t uVar2;
  uint32_t *puVar3;
  uint32_t in_EDX;
  int in_ESI;
  uint32_t in_EDI;
  uint32_t *in_R8;
  long in_R9;
  int in_stack_00000008;
  int in_stack_00000010;
  undefined4 in_stack_00000018;
  int in_stack_00000020;
  int x_end;
  int mode;
  uint8_t *tmp8;
  uint32_t *tmp32;
  int x;
  int y;
  uint8_t *lower_max_diffs;
  uint8_t *current_max_diffs;
  uint32_t *current_row;
  uint32_t *upper_row;
  int tiles_per_row;
  uint32_t in_stack_ffffffffffffff30;
  undefined4 in_stack_ffffffffffffff34;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  int in_stack_ffffffffffffff60;
  uint32_t local_98;
  uint32_t *in_stack_ffffffffffffff70;
  uint32_t *puVar4;
  uint32_t y_00;
  int local_7c;
  uint32_t *puVar5;
  uint32_t *puVar6;
  uint32_t *puVar7;
  uint32_t *out;
  
  uVar2 = VP8LSubSampleSize(in_EDI,in_EDX);
  puVar4 = in_R8 + (long)(int)in_EDI + 1 + (long)(int)in_EDI + 1;
  puVar3 = (uint32_t *)((long)puVar4 + (long)(int)in_EDI);
  puVar6 = in_R8 + (long)(int)in_EDI + 1;
  for (local_7c = 0; local_7c < in_ESI; local_7c = local_7c + 1) {
    puVar7 = in_R8;
    memcpy(in_R8,(void *)(in_R9 + (long)(int)(local_7c * in_EDI) * 4),
           (long)(int)(in_EDI + (local_7c + 1 < in_ESI)) << 2);
    if (in_stack_00000008 == 0) {
      puVar5 = puVar3;
      puVar1 = puVar4;
      out = puVar6;
      if ((1 < in_stack_00000010) &&
         (in_stack_ffffffffffffff70 = puVar4, puVar5 = puVar4, puVar1 = puVar3,
         local_7c + 2 < in_ESI)) {
        MaxDiffsForRow(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50,
                       (uint32_t *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                       (uint8_t *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                       in_stack_ffffffffffffff3c);
        in_stack_ffffffffffffff70 = puVar4;
        puVar1 = puVar3;
        out = puVar6;
      }
      puVar4 = puVar1;
      puVar3 = puVar5;
      y_00 = 0;
      while ((int)y_00 < (int)in_EDI) {
        local_98 = y_00 + (1 << ((byte)in_EDX & 0x1f));
        if ((int)in_EDI < (int)local_98) {
          local_98 = in_EDI;
        }
        in_stack_ffffffffffffff30 = local_98;
        in_stack_ffffffffffffff38 = local_7c;
        in_stack_ffffffffffffff40 = in_stack_00000010;
        in_stack_ffffffffffffff48 = in_stack_00000018;
        in_stack_ffffffffffffff50 = in_stack_00000020;
        GetResidual((local_7c >> ((byte)in_EDX & 0x1f)) * uVar2,in_stack_ffffffffffffff60,
                    (uint32_t *)(in_R9 + (long)(int)(local_7c * in_EDI) * 4 + (long)(int)y_00 * 4),
                    (uint32_t *)CONCAT44(in_stack_ffffffffffffff54,in_stack_00000020),
                    (uint8_t *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_00000018),
                    in_stack_ffffffffffffff44,(int)in_stack_ffffffffffffff70,(int)in_R8,y_00,
                    (int)puVar3,(int)puVar4,(int)puVar7,out);
        y_00 = local_98;
      }
    }
    else {
      PredictBatch(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                   in_stack_ffffffffffffff38,
                   (uint32_t *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   (uint32_t *)(in_R9 + (long)(int)(local_7c * in_EDI) * 4),
                   (uint32_t *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
      out = puVar6;
    }
    puVar6 = puVar7;
    in_R8 = out;
  }
  return;
}

Assistant:

static void CopyImageWithPrediction(int width, int height, int bits,
                                    const uint32_t* const modes,
                                    uint32_t* const argb_scratch,
                                    uint32_t* const argb, int low_effort,
                                    int max_quantization, int exact,
                                    int used_subtract_green) {
  const int tiles_per_row = VP8LSubSampleSize(width, bits);
  // The width of upper_row and current_row is one pixel larger than image width
  // to allow the top right pixel to point to the leftmost pixel of the next row
  // when at the right edge.
  uint32_t* upper_row = argb_scratch;
  uint32_t* current_row = upper_row + width + 1;
  uint8_t* current_max_diffs = (uint8_t*)(current_row + width + 1);
#if (WEBP_NEAR_LOSSLESS == 1)
  uint8_t* lower_max_diffs = current_max_diffs + width;
#endif
  int y;

  for (y = 0; y < height; ++y) {
    int x;
    uint32_t* const tmp32 = upper_row;
    upper_row = current_row;
    current_row = tmp32;
    memcpy(current_row, argb + y * width,
           sizeof(*argb) * (width + (y + 1 < height)));

    if (low_effort) {
      PredictBatch(kPredLowEffort, 0, y, width, current_row, upper_row,
                   argb + y * width);
    } else {
#if (WEBP_NEAR_LOSSLESS == 1)
      if (max_quantization > 1) {
        // Compute max_diffs for the lower row now, because that needs the
        // contents of argb for the current row, which we will overwrite with
        // residuals before proceeding with the next row.
        uint8_t* const tmp8 = current_max_diffs;
        current_max_diffs = lower_max_diffs;
        lower_max_diffs = tmp8;
        if (y + 2 < height) {
          MaxDiffsForRow(width, width, argb + (y + 1) * width, lower_max_diffs,
                         used_subtract_green);
        }
      }
#endif
      for (x = 0; x < width;) {
        const int mode =
            (modes[(y >> bits) * tiles_per_row + (x >> bits)] >> 8) & 0xff;
        int x_end = x + (1 << bits);
        if (x_end > width) x_end = width;
        GetResidual(width, height, upper_row, current_row, current_max_diffs,
                    mode, x, x_end, y, max_quantization, exact,
                    used_subtract_green, argb + y * width + x);
        x = x_end;
      }
    }
  }
}